

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O0

RC __thiscall QL_Manager::SetUpPrinter(QL_Manager *this,QL_Node *topNode,DataAttrInfo *attributes)

{
  RC RVar1;
  DataAttrInfo *pDVar2;
  AttrCatEntry *pAVar3;
  int local_4c;
  int local_48;
  int length;
  int offset;
  int index;
  int i;
  int attrListSize;
  int *attrList;
  DataAttrInfo *pDStack_28;
  RC rc;
  DataAttrInfo *attributes_local;
  QL_Node *topNode_local;
  QL_Manager *this_local;
  
  attrList._4_4_ = 0;
  pDStack_28 = attributes;
  attributes_local = (DataAttrInfo *)topNode;
  topNode_local = (QL_Node *)this;
  this_local._4_4_ = QL_Node::GetAttrList(topNode,(int **)&i,&index);
  if (this_local._4_4_ == 0) {
    for (offset = 0; attrList._4_4_ = 0, offset < index; offset = offset + 1) {
      length = _i[offset];
      pDVar2 = pDStack_28 + offset;
      pAVar3 = this->attrEntries + length;
      *(undefined8 *)pDVar2->relName = *(undefined8 *)pAVar3->relName;
      *(undefined8 *)(pDVar2->relName + 8) = *(undefined8 *)(pAVar3->relName + 8);
      *(undefined8 *)(pDVar2->relName + 0x10) = *(undefined8 *)(pAVar3->relName + 0x10);
      pDVar2->relName[0x18] = pAVar3->relName[0x18];
      pAVar3 = this->attrEntries;
      *(undefined8 *)pDStack_28[offset].attrName = *(undefined8 *)pAVar3[length].attrName;
      *(undefined8 *)(pDStack_28[offset].attrName + 8) =
           *(undefined8 *)(pAVar3[length].attrName + 8);
      *(undefined8 *)(pDStack_28[offset].attrName + 0x10) =
           *(undefined8 *)(pAVar3[length].attrName + 0x10);
      pDStack_28[offset].attrName[0x18] = pAVar3[length].attrName[0x18];
      pDStack_28[offset].attrType = this->attrEntries[length].attrType;
      pDStack_28[offset].attrLength = this->attrEntries[length].attrLength;
      pDStack_28[offset].indexNo = this->attrEntries[length].indexNo;
      RVar1 = QL_Node::IndexToOffset((QL_Node *)attributes_local,length,&local_48,&local_4c);
      if (RVar1 != 0) {
        return RVar1;
      }
      pDStack_28[offset].offset = local_48;
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

RC QL_Manager::SetUpPrinter(QL_Node *topNode, DataAttrInfo *attributes){
  RC rc = 0;
  // Retrieve the attribute list from the top node
  int *attrList;
  int attrListSize;
  if((rc = topNode->GetAttrList(attrList, attrListSize)))
    return (rc);
  
  // Set up the attributes to print by tapping into attrEntries 
  for(int i=0; i < attrListSize; i++){
    int index = attrList[i];
    memcpy(attributes[i].relName, attrEntries[index].relName, MAXNAME + 1);
    memcpy(attributes[i].attrName, attrEntries[index].attrName, MAXNAME + 1);
    attributes[i].attrType = attrEntries[index].attrType;
    attributes[i].attrLength = attrEntries[index].attrLength;
    attributes[i].indexNo = attrEntries[index].indexNo;
    int offset, length;
    if((rc = topNode->IndexToOffset(index, offset, length)))
      return (rc);
    attributes[i].offset = offset;
  }

  return (0);
}